

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
validate_attr_arguments
          (exr_context_t ctxt,exr_attribute_list_t *list,char *name,int32_t data_len,
          uint8_t **data_ptr,exr_attribute_t **attr)

{
  exr_result_t eVar1;
  int in_ECX;
  exr_attribute_t **in_RDX;
  char *in_RSI;
  exr_attribute_list_t *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  exr_result_t rv;
  exr_attribute_t *nattr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI == (char *)0x0) {
    eVar1 = (*(code *)in_RDI[2].sorted_entries)(in_RDI,3,"Invalid list pointer to attr_list_add");
  }
  else if (in_R9 == (undefined8 *)0x0) {
    eVar1 = (*(code *)in_RDI[2].sorted_entries)
                      (in_RDI,3,"Invalid output attribute pointer location to attr_list_add");
  }
  else {
    *in_R9 = 0;
    if (in_ECX < 0) {
      eVar1 = (**(code **)(in_RDI + 3))
                        (in_RDI,3,"Extra data storage requested negative length (%d)",in_ECX);
    }
    else if ((in_ECX < 1) || (in_R8 != (undefined8 *)0x0)) {
      if (in_R8 != (undefined8 *)0x0) {
        *in_R8 = 0;
      }
      if ((in_RDX == (exr_attribute_t **)0x0) || (*(char *)in_RDX == '\0')) {
        eVar1 = (*(code *)in_RDI[2].sorted_entries)(in_RDI,3,"Invalid name to add_by_type");
      }
      else {
        eVar1 = exr_attr_list_find_by_name
                          ((exr_const_context_t)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI,in_RDX);
        if (eVar1 == 0) {
          if ((in_R8 == (undefined8 *)0x0) || (in_ECX < 1)) {
            *in_R9 = 0;
            eVar1 = -1;
          }
          else {
            eVar1 = (**(code **)(in_RDI + 3))
                              (in_RDI,3,
                               "Attribute \'%s\' (type %s) already in list but requesting additional data"
                               ,in_RDX,uRam0000000000000008);
          }
        }
        else {
          eVar1 = 0;
        }
      }
    }
    else {
      eVar1 = (**(code **)(in_RDI + 3))
                        (in_RDI,3,
                         "Extra data storage output pointer must be provided when requesting extra data (%d)"
                         ,in_ECX);
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
validate_attr_arguments (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    exr_attribute_t* nattr = NULL;
    exr_result_t     rv;
    if (!list)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer to attr_list_add");
    }

    if (!attr)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid output attribute pointer location to attr_list_add");
    }

    *attr = NULL;

    if (data_len < 0)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Extra data storage requested negative length (%d)",
            data_len);
    }
    else if (data_len > 0 && !data_ptr)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Extra data storage output pointer must be provided when requesting extra data (%d)",
            data_len);
    }
    else if (data_ptr)
        *data_ptr = NULL;

    if (!name || name[0] == '\0')
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid name to add_by_type");
    }

    /* is it already in the list? */
    rv = exr_attr_list_find_by_name (ctxt, list, name, &nattr);

    if (rv == EXR_ERR_SUCCESS)
    {
        if (data_ptr && data_len > 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Attribute '%s' (type %s) already in list but requesting additional data",
                name,
                nattr->type_name);
        }

        *attr = nattr;
        return -1;
    }

    return EXR_ERR_SUCCESS;
}